

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O2

int point_mul_id_tc26_gost_3410_2012_256_paramSetA
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *out1;
  uint64_t *out1_00;
  char cVar1;
  int iVar2;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  pt_prj_t_conflict1 *arg3;
  uint uVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  uchar b_y [32];
  uchar b_x [32];
  pt_aff_t_conflict1 local_c58;
  pt_prj_t_conflict1 local_bd8;
  uchar b_m [32];
  pt_prj_t_conflict1 Q;
  int8_t rnaf [52];
  pt_prj_t_conflict1 local_a38 [16];
  
  BN_CTX_start((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  iVar3 = 0;
  iVar9 = 0;
  if ((((pBVar5 != (BIGNUM *)0x0) &&
       (iVar2 = EC_POINT_get_affine_coordinates(group,q,pBVar4,pBVar5,ctx), iVar2 != 0)) &&
      (iVar2 = BN_bn2lebinpad(pBVar4,b_x,0x20), iVar9 = iVar3, iVar2 == 0x20)) &&
     ((iVar3 = BN_bn2lebinpad(pBVar5,b_y,0x20), iVar3 == 0x20 &&
      (iVar3 = BN_bn2lebinpad(m,b_m,0x20), iVar3 == 0x20)))) {
    fiat_id_tc26_gost_3410_2012_256_paramSetA_from_bytes(local_c58.X,b_x);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_from_bytes(local_c58.Y,b_y);
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    lVar8 = 0;
    memset(&Q,0,0xa0);
    memset(&local_bd8,0,0xa0);
    precomp_wnaf(local_a38,&local_c58);
    scalar_rwnaf(rnaf,b_m);
    iVar9 = (int)rnaf[0x33];
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      bVar11 = (int)(iVar9 + -1 >> 1 ^ (uint)lVar10) < 1;
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                (Q.X,bVar11,Q.X,(uint64_t *)((long)local_a38[0].X + lVar8));
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                (Q.Y,bVar11,Q.Y,(uint64_t *)((long)local_a38[0].Y + lVar8));
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                (Q.T,bVar11,Q.T,(uint64_t *)((long)local_a38[0].T + lVar8));
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz
                (Q.Z,bVar11,Q.Z,(uint64_t *)((long)local_a38[0].Z + lVar8));
      lVar8 = lVar8 + 0xa0;
    }
    for (uVar6 = 0x32; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      iVar9 = 5;
      while (bVar11 = iVar9 != 0, iVar9 = iVar9 + -1, bVar11) {
        point_double(&Q,&Q);
      }
      cVar1 = rnaf[uVar6];
      arg3 = local_a38;
      for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
        bVar11 = (int)((int)(char)(-1 - (cVar1 >> 7)) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                      (uint)lVar8) < 1;
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_bd8.X,bVar11,local_bd8.X,arg3->X);
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_bd8.Y,bVar11,local_bd8.Y,arg3->Y);
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_bd8.T,bVar11,local_bd8.T,arg3->T);
        fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_bd8.Z,bVar11,local_bd8.Z,arg3->Z);
        arg3 = arg3 + 1;
      }
      local_c58.X[4] = 0xffffffffffffe - local_bd8.X[4];
      local_c58.X[0] = 0x1ffffffffffb2e - local_bd8.X[0];
      local_c58.X[1] = 0xffffffffffffe - local_bd8.X[1];
      local_c58.X[2] = 0xffffffffffffe - local_bd8.X[2];
      local_c58.X[3] = 0xffffffffffffe - local_bd8.X[3];
      local_c58.T[4] = 0xffffffffffffe - local_bd8.T[4];
      local_c58.T[0] = 0x1ffffffffffb2e - local_bd8.T[0];
      local_c58.T[1] = 0xffffffffffffe - local_bd8.T[1];
      local_c58.T[2] = 0xffffffffffffe - local_bd8.T[2];
      local_c58.T[3] = 0xffffffffffffe - local_bd8.T[3];
      bVar7 = (byte)(cVar1 >> 7) >> 7;
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_bd8.X,bVar7,local_bd8.X,local_c58.X)
      ;
      fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(local_bd8.T,bVar7,local_bd8.T,local_c58.T)
      ;
      point_add_proj(&Q,&Q,&local_bd8);
    }
    local_bd8.X[4] = 0xffffffffffffe - local_a38[0].X[4];
    local_bd8.X[0] = 0x1ffffffffffb2e - local_a38[0].X[0];
    local_bd8.X[1] = 0xffffffffffffe - local_a38[0].X[1];
    local_bd8.X[2] = 0xffffffffffffe - local_a38[0].X[2];
    local_bd8.X[3] = 0xffffffffffffe - local_a38[0].X[3];
    local_bd8.Y[4] = local_a38[0].Y[4];
    local_bd8.Y[2] = local_a38[0].Y[2];
    local_bd8.Y[3] = local_a38[0].Y[3];
    local_bd8.T[4] = 0xffffffffffffe - local_a38[0].T[4];
    local_bd8.T[0] = 0x1ffffffffffb2e - local_a38[0].T[0];
    local_bd8.T[1] = 0xffffffffffffe - local_a38[0].T[1];
    local_bd8.Y[0] = local_a38[0].Y[0];
    local_bd8.Y[1] = local_a38[0].Y[1];
    local_bd8.T[2] = 0xffffffffffffe - local_a38[0].T[2];
    local_bd8.T[3] = 0xffffffffffffe - local_a38[0].T[3];
    local_bd8.Z[4] = local_a38[0].Z[4];
    local_bd8.Z[2] = local_a38[0].Z[2];
    local_bd8.Z[3] = local_a38[0].Z[3];
    local_bd8.Z[0] = local_a38[0].Z[0];
    local_bd8.Z[1] = local_a38[0].Z[1];
    point_add_proj(&local_bd8,&local_bd8,&Q);
    bVar7 = b_m[0] & 1;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(Q.X,bVar7,local_bd8.X,Q.X);
    out1 = Q.Y;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(out1,bVar7,local_bd8.Y,out1);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(Q.T,bVar7,local_bd8.T,Q.T);
    out1_00 = Q.Z;
    fiat_id_tc26_gost_3410_2012_256_paramSetA_selectznz(out1_00,bVar7,local_bd8.Z,out1_00);
    point_double(&Q,&Q);
    point_double(&Q,&Q);
    point_edwards2legacy(&Q,&Q);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_inv(out1_00,out1_00);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_c58.X,Q.X,out1_00);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_carry_mul(local_c58.Y,out1,out1_00);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(b_x,local_c58.X);
    fiat_id_tc26_gost_3410_2012_256_paramSetA_to_bytes(b_y,local_c58.Y);
    iVar9 = CRYPTO_memcmp("",b_x,0x20);
    if ((iVar9 == 0) && (iVar9 = CRYPTO_memcmp("",b_y,0x20), iVar9 == 0)) {
      iVar9 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar9 == 0) {
        iVar9 = 0;
        goto LAB_00112075;
      }
    }
    else {
      lVar8 = BN_lebin2bn(b_x,0x20,pBVar4);
      iVar9 = 0;
      if ((lVar8 == 0) ||
         ((lVar8 = BN_lebin2bn(b_y,0x20,pBVar5), lVar8 == 0 ||
          (iVar3 = EC_POINT_set_affine_coordinates(group,r,pBVar4,pBVar5,ctx), iVar3 == 0))))
      goto LAB_00112075;
    }
    iVar9 = 1;
  }
LAB_00112075:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar9;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_256_paramSetA(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[32];
    unsigned char b_y[32];
    unsigned char b_m[32];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 32) != 32 || BN_bn2lebinpad(y, b_y, 32) != 32 ||
        BN_bn2lebinpad(m, b_m, 32) != 32)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 32) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 32) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 32, x) == NULL ||
            BN_lebin2bn(b_y, 32, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}